

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringprintf.cc
# Opt level: O3

string * google::protobuf::StringPrintfVector
                   (string *__return_storage_ptr__,char *format,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *v)

{
  LogMessage *pLVar1;
  long lVar2;
  pointer pbVar3;
  ulong uVar4;
  pointer pbVar5;
  long lVar6;
  char *cstr [32];
  undefined8 uStack_130;
  LogMessage local_128;
  undefined4 uStack_f0;
  undefined4 local_e8;
  undefined4 uStack_e0;
  undefined4 local_d8;
  undefined4 uStack_d0;
  undefined4 local_c8;
  undefined4 uStack_c0;
  undefined4 local_b8;
  undefined4 uStack_b0;
  undefined4 local_a8;
  undefined4 uStack_a0;
  undefined4 local_98;
  undefined4 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  pbVar3 = (v->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar5 = (v->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar4 = (long)pbVar5 - (long)pbVar3;
  if (0x400 < uVar4) {
    internal::LogMessage::LogMessage
              (&local_128,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/stubs/stringprintf.cc"
               ,0x8d);
    pLVar1 = internal::LogMessage::operator<<
                       (&local_128,"CHECK failed: (v.size()) <= (kStringPrintfVectorMaxArgs): ");
    pLVar1 = internal::LogMessage::operator<<
                       (pLVar1,"StringPrintfVector currently only supports up to ");
    pLVar1 = internal::LogMessage::operator<<(pLVar1,0x20);
    pLVar1 = internal::LogMessage::operator<<(pLVar1," arguments. ");
    pLVar1 = internal::LogMessage::operator<<
                       (pLVar1,"Feel free to add support for more if you need it.");
    internal::LogFinisher::operator=((LogFinisher *)((long)&uStack_130 + 7),pLVar1);
    internal::LogMessage::~LogMessage(&local_128);
    pbVar3 = (v->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar5 = (v->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    uVar4 = (long)pbVar5 - (long)pbVar3;
  }
  lVar2 = (long)uVar4 >> 5;
  if (pbVar5 != pbVar3) {
    lVar6 = 0;
    do {
      *(pointer *)(&local_128.level_ + lVar6 * 2) = (pbVar3->_M_dataplus)._M_p;
      lVar6 = lVar6 + 1;
      pbVar3 = pbVar3 + 1;
    } while (lVar2 + (ulong)(lVar2 == 0) != lVar6);
  }
  if ((uVar4 & 0x1ffffffc00) == 0) {
    uVar4 = (ulong)((uint)lVar2 & 0x1f);
    do {
      uVar4 = uVar4 + 1;
      (&uStack_130)[uVar4] = string_printf_empty_block;
    } while ((int)uVar4 != 0x20);
  }
  StringPrintf_abi_cxx11_
            (__return_storage_ptr__,format,local_128._0_8_,local_128.filename_,local_128._16_8_,
             local_128.message_._M_dataplus._M_p,(undefined4)local_128.message_._M_string_length,
             local_128.message_.field_2._M_allocated_capacity._0_4_,local_128.message_.field_2._8_4_
             ,uStack_f0,local_e8,uStack_e0,local_d8,uStack_d0,local_c8,uStack_c0,local_b8,uStack_b0,
             local_a8,uStack_a0,local_98,uStack_90,local_88,uStack_80,local_78,uStack_70,local_68,
             uStack_60,local_58,uStack_50,local_48,uStack_40,local_38,uStack_30);
  return __return_storage_ptr__;
}

Assistant:

string StringPrintfVector(const char* format, const vector<string>& v) {
  GOOGLE_CHECK_LE(v.size(), kStringPrintfVectorMaxArgs)
      << "StringPrintfVector currently only supports up to "
      << kStringPrintfVectorMaxArgs << " arguments. "
      << "Feel free to add support for more if you need it.";

  // Add filler arguments so that bogus format+args have a harder time
  // crashing the program, corrupting the program (%n),
  // or displaying random chunks of memory to users.

  const char* cstr[kStringPrintfVectorMaxArgs];
  for (int i = 0; i < v.size(); ++i) {
    cstr[i] = v[i].c_str();
  }
  for (int i = v.size(); i < GOOGLE_ARRAYSIZE(cstr); ++i) {
    cstr[i] = &string_printf_empty_block[0];
  }

  // I do not know any way to pass kStringPrintfVectorMaxArgs arguments,
  // or any way to build a va_list by hand, or any API for printf
  // that accepts an array of arguments.  The best I can do is stick
  // this COMPILE_ASSERT right next to the actual statement.

  GOOGLE_COMPILE_ASSERT(kStringPrintfVectorMaxArgs == 32, arg_count_mismatch);
  return StringPrintf(format,
                      cstr[0], cstr[1], cstr[2], cstr[3], cstr[4],
                      cstr[5], cstr[6], cstr[7], cstr[8], cstr[9],
                      cstr[10], cstr[11], cstr[12], cstr[13], cstr[14],
                      cstr[15], cstr[16], cstr[17], cstr[18], cstr[19],
                      cstr[20], cstr[21], cstr[22], cstr[23], cstr[24],
                      cstr[25], cstr[26], cstr[27], cstr[28], cstr[29],
                      cstr[30], cstr[31]);
}